

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O1

int ExtractMetadataFromJPEG(j_decompress_ptr dinfo,Metadata *metadata)

{
  byte bVar1;
  long *plVar2;
  JOCTET *__s1;
  void *__s2;
  bool bVar3;
  int iVar4;
  uint8_t *puVar5;
  uint uVar6;
  Metadata *pMVar7;
  uint uVar8;
  jpeg_saved_marker_ptr pjVar9;
  char *__format;
  uint uVar10;
  ulong uVar11;
  size_t __size;
  uint uVar12;
  jpeg_saved_marker_ptr_conflict pjVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  size_t metadata_len;
  ICCPSegment iccp_segments [255];
  long lStack_1830;
  Metadata *local_1828;
  j_decompress_ptr local_1820;
  long local_1818;
  Metadata *pMStack_1810;
  undefined4 auStack_1808 [1526];
  
  uVar15 = 0;
  lStack_1830 = 0x104ea9;
  local_1828 = metadata;
  memset(&local_1818,0,0x17e8);
  pjVar13 = dinfo->marker_list;
  local_1820 = dinfo;
  if (pjVar13 == (jpeg_saved_marker_ptr_conflict)0x0) {
    __size = 0;
    uVar8 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    uVar8 = 0;
    uVar15 = 0;
    __size = 0;
    do {
      if (((pjVar13->marker == 0xe2) && (0xe < (ulong)pjVar13->data_length)) &&
         (plVar2 = (long *)pjVar13->data,
         (int)plVar2[1] == 0x454c49 && *plVar2 == 0x464f52505f434349)) {
        bVar1 = *(byte *)((long)plVar2 + 0xc);
        pMVar7 = (Metadata *)((ulong)pjVar13->data_length - 0xe);
        if ((*(byte *)((long)plVar2 + 0xd) == 0) || (bVar1 == 0)) {
          lStack_1830 = 0x104fb4;
          fprintf(stderr,"[ICCP] size (%d) / count (%d) / sequence number (%d) cannot be 0!\n");
LAB_00104fc7:
          bVar3 = false;
          uVar12 = uVar6;
        }
        else {
          uVar10 = (uint)*(byte *)((long)plVar2 + 0xd);
          uVar12 = uVar10;
          if ((uVar6 != 0) && (uVar12 = uVar6, uVar6 != uVar10)) {
            lStack_1830 = 0x104f59;
            fprintf(stderr,"[ICCP] Inconsistent segment count (%d / %d)!\n",(ulong)uVar6,
                    (ulong)uVar10);
            goto LAB_00104fc7;
          }
          uVar11 = (ulong)(uint)bVar1;
          if ((&local_1828)[uVar11 * 3] != (Metadata *)0x0) {
            lStack_1830 = 0x104fc7;
            fprintf(stderr,"[ICCP] Duplicate segment number (%d)!\n",(ulong)(uint)bVar1);
            uVar6 = uVar12;
            goto LAB_00104fc7;
          }
          (&lStack_1830)[uVar11 * 3] = (long)plVar2 + 0xe;
          (&local_1828)[uVar11 * 3] = pMVar7;
          uVar6 = (uint)bVar1;
          *(uint *)(&local_1820 + uVar11 * 3) = uVar6;
          __size = (long)&(pMVar7->exif).bytes + __size;
          if (uVar15 <= uVar6) {
            uVar15 = uVar6;
          }
          uVar8 = uVar8 + 1;
          bVar3 = true;
        }
        uVar6 = uVar12;
        if (!bVar3) {
          return 0;
        }
      }
      pjVar13 = pjVar13->next;
    } while (pjVar13 != (jpeg_saved_marker_ptr)0x0);
  }
  if (uVar8 != 0) {
    if (uVar15 == uVar8) {
      if (uVar6 == uVar8) {
        lStack_1830 = 0x105022;
        qsort(&local_1818,(ulong)uVar8,0x18,CompareICCPSegments);
        lStack_1830 = 0x10502a;
        puVar5 = (uint8_t *)malloc(__size);
        (local_1828->iccp).bytes = puVar5;
        if (puVar5 == (uint8_t *)0x0) {
          return 0;
        }
        (local_1828->iccp).size = __size;
        if (uVar15 != 0) {
          lVar14 = 0;
          lVar16 = 0;
          do {
            lStack_1830 = 0x10506b;
            memcpy((local_1828->iccp).bytes + lVar16,*(void **)((long)&local_1818 + lVar14),
                   *(size_t *)((long)auStack_1808 + lVar14 + -8));
            lVar16 = lVar16 + *(long *)((long)auStack_1808 + lVar14 + -8);
            lVar14 = lVar14 + 0x18;
          } while ((ulong)uVar15 * 0x18 != lVar14);
        }
        goto LAB_0010507d;
      }
      __format = "[ICCP] Segment count: %d does not match expected: %d!\n";
      uVar15 = uVar6;
    }
    else {
      __format = "[ICCP] Discontinuous segments, expected: %d actual: %d!\n";
    }
    lStack_1830 = 0x105186;
    fprintf(stderr,__format,(ulong)uVar8,(ulong)uVar15);
    return 0;
  }
LAB_0010507d:
  pjVar9 = local_1820->marker_list;
  if (pjVar9 == (jpeg_saved_marker_ptr_conflict)0x0) {
    return 1;
  }
  do {
    uVar15 = 0xe1;
    lVar14 = 0;
    do {
      if (uVar15 == pjVar9->marker) {
        uVar11 = *(ulong *)((long)&ExtractMetadataFromJPEG::kJPEGMetadataMap[0].signature_length +
                           lVar14);
        metadata_len = pjVar9->data_length - uVar11;
        if (uVar11 <= pjVar9->data_length && metadata_len != 0) {
          __s1 = pjVar9->data;
          __s2 = *(void **)((long)&ExtractMetadataFromJPEG::kJPEGMetadataMap[0].signature + lVar14);
          lStack_1830 = 0x1050d2;
          iVar4 = bcmp(__s1,__s2,uVar11);
          if (iVar4 == 0) {
            lVar16 = *(long *)((long)&ExtractMetadataFromJPEG::kJPEGMetadataMap[0].storage_offset +
                              lVar14);
            if (*(long *)((long)&(local_1828->exif).bytes + lVar16) == 0) {
              lStack_1830 = 0x1050fe;
              iVar4 = MetadataCopy((char *)(__s1 + uVar11),metadata_len,
                                   (MetadataPayload *)((long)&(local_1828->exif).bytes + lVar16));
              if (iVar4 == 0) {
                return 0;
              }
            }
            else {
              lStack_1830 = 0x105134;
              fprintf(stderr,"Ignoring additional \'%s\' marker\n",__s2);
            }
          }
        }
      }
      uVar15 = *(uint *)((long)&ExtractMetadataFromJPEG::kJPEGMetadataMap[1].marker + lVar14);
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0x40);
    pjVar9 = pjVar9->next;
  } while (pjVar9 != (jpeg_saved_marker_ptr)0x0);
  return 1;
}

Assistant:

static int ExtractMetadataFromJPEG(j_decompress_ptr dinfo,
                                   Metadata* const metadata) {
  static const struct {
    int marker;
    const char* signature;
    size_t signature_length;
    size_t storage_offset;
  } kJPEGMetadataMap[] = {
    // Exif 2.2 Section 4.7.2 Interoperability Structure of APP1 ...
    { JPEG_APP1, "Exif\0",                        6, METADATA_OFFSET(exif) },
    // XMP Specification Part 3 Section 3 Embedding XMP Metadata ... #JPEG
    // TODO(jzern) Add support for 'ExtendedXMP'
    { JPEG_APP1, "http://ns.adobe.com/xap/1.0/", 29, METADATA_OFFSET(xmp) },
    { 0, NULL, 0, 0 },
  };
  jpeg_saved_marker_ptr marker;
  // Treat ICC profiles separately as they may be segmented and out of order.
  if (!StoreICCP(dinfo, &metadata->iccp)) return 0;

  for (marker = dinfo->marker_list; marker != NULL; marker = marker->next) {
    int i;
    for (i = 0; kJPEGMetadataMap[i].marker != 0; ++i) {
      if (marker->marker == kJPEGMetadataMap[i].marker &&
          marker->data_length > kJPEGMetadataMap[i].signature_length &&
          !memcmp(marker->data, kJPEGMetadataMap[i].signature,
                  kJPEGMetadataMap[i].signature_length)) {
        MetadataPayload* const payload =
            (MetadataPayload*)((uint8_t*)metadata +
                               kJPEGMetadataMap[i].storage_offset);

        if (payload->bytes == NULL) {
          const char* marker_data = (const char*)marker->data +
                                    kJPEGMetadataMap[i].signature_length;
          const size_t marker_data_length =
              marker->data_length - kJPEGMetadataMap[i].signature_length;
          if (!MetadataCopy(marker_data, marker_data_length, payload)) return 0;
        } else {
          fprintf(stderr, "Ignoring additional '%s' marker\n",
                  kJPEGMetadataMap[i].signature);
        }
      }
    }
  }
  return 1;
}